

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

ReturnCode macroid(Global *global,int *c)

{
  ReturnCode RVar1;
  int iVar2;
  DEFBUF *pDVar3;
  int *in_RSI;
  long in_RDI;
  bool bVar4;
  ReturnCode ret;
  DEFBUF *dp;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(long *)(in_RDI + 0x28) != 0) && (*(long *)(*(long *)(in_RDI + 0x28) + 0x10) != 0)) {
    *(undefined4 *)(in_RDI + 0x30) = 0;
  }
  while( true ) {
    bVar4 = false;
    if (type[*in_RSI] == '\x02') {
      pDVar3 = lookid((Global *)dp,ret);
      bVar4 = pDVar3 != (DEFBUF *)0x0;
    }
    if (!bVar4) break;
    RVar1 = expand(global,(DEFBUF *)c);
    if (RVar1 != FPP_OK) {
      return RVar1;
    }
    iVar2 = get((Global *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    *in_RSI = iVar2;
  }
  return FPP_OK;
}

Assistant:

ReturnCode macroid(struct Global *global, int *c)
{
  /*
   * If c is a letter, scan the id.  if it's #defined, expand it and scan
   * the next character and try again.
   *
   * Else, return the character. If type[c] is a LET, the token is in tokenbuf.
   */
  DEFBUF *dp;
  ReturnCode ret=FPP_OK;
  
  if (global->infile != NULL && global->infile->fp != NULL)
    global->recursion = 0;
  while (type[*c] == LET && (dp = lookid(global, *c)) != NULL) {
    if((ret=expand(global, dp)))
      return(ret);
    *c = get(global);
  }
  return(FPP_OK);
}